

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O0

void __thiscall CClassList::Add(CClassList *this,CClass *cClass)

{
  unique_ptr<CClass,_std::default_delete<CClass>_> local_20;
  CClass *local_18;
  CClass *cClass_local;
  CClassList *this_local;
  
  local_18 = cClass;
  cClass_local = (CClass *)this;
  std::unique_ptr<CClass,std::default_delete<CClass>>::unique_ptr<std::default_delete<CClass>,void>
            ((unique_ptr<CClass,std::default_delete<CClass>> *)&local_20,cClass);
  std::
  vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
  ::push_back(&this->classes,(value_type *)&local_20);
  std::unique_ptr<CClass,_std::default_delete<CClass>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

void CClassList::Add(CClass* cClass) {
	classes.push_back(std::unique_ptr<CClass>(cClass));
}